

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3e00dc::AVxEncoderThreadTest::DoTestMaxThreads
          (AVxEncoderThreadTest *this,YUVVideoSource *video,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *ref_size_enc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref_md5_enc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref_md5_dec)

{
  bool bVar1;
  AssertHelper *this_00;
  HasNewFatalFailureHelper *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  multi_thr_max_row_mt_md5_dec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  multi_thr_max_row_mt_md5_enc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> multi_thr_max_row_mt_size_enc;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  HasNewFatalFailureHelper *in_stack_fffffffffffffeb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  int iVar2;
  char *lhs_expression;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  Type type;
  AssertionResult local_f8 [2];
  Message *in_stack_ffffffffffffff28;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff50;
  char local_78 [40];
  uint local_50;
  HasNewFatalFailureHelper local_40 [2];
  undefined8 local_10;
  
  type = (Type)((ulong)in_RDX >> 0x20);
  iVar2 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  *(undefined4 *)(in_RDI + 0x34) = 0x40;
  local_10 = in_RSI;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_RCX);
    in_stack_fffffffffffffed7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffed7) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_10);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(local_40);
    if (bVar1) {
      local_50 = 2;
    }
    else {
      local_50 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (in_stack_fffffffffffffeb0);
    if (local_50 == 0) {
      lhs_expression = local_78;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x531baf);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x531bbc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x531bc9);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_ffffffffffffff50._M_head_impl,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff48)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff50._M_head_impl,in_stack_ffffffffffffff48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff50._M_head_impl,in_stack_ffffffffffffff48);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x531c28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x531c39);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x531c4a);
      testing::internal::EqHelper::
      Compare<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_nullptr>
                (lhs_expression,(char *)in_stack_fffffffffffffec0,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff48);
      if (!bVar1) {
        testing::Message::Message((Message *)in_RCX);
        in_stack_fffffffffffffec0 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0x531cc1);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_RCX,type,
                   (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   (int)((ulong)lhs_expression >> 0x20),(char *)in_stack_fffffffffffffec0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffff30._M_head_impl,in_stack_ffffffffffffff28)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
        testing::Message::~Message((Message *)0x531d1e);
      }
      local_50 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x531da2);
      if (local_50 == 0) {
        testing::internal::EqHelper::
        Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                  (lhs_expression,(char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffeb0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff28);
        if (!bVar1) {
          testing::Message::Message((Message *)in_RCX);
          in_stack_fffffffffffffeb8 =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)testing::AssertionResult::failure_message((AssertionResult *)0x531e20);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_RCX,type,
                     (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                     (int)((ulong)lhs_expression >> 0x20),(char *)in_stack_fffffffffffffec0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_ffffffffffffff30._M_head_impl,
                     in_stack_ffffffffffffff28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
          testing::Message::~Message((Message *)0x531e6e);
        }
        local_50 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x531eec);
        if (local_50 == 0) {
          testing::internal::EqHelper::
          Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                    (lhs_expression,(char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffeb0);
          iVar2 = (int)((ulong)lhs_expression >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_RCX);
            this_00 = (AssertHelper *)
                      testing::AssertionResult::failure_message((AssertionResult *)0x531f61);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_RCX,type,
                       (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),iVar2,
                       (char *)in_stack_fffffffffffffec0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_ffffffffffffff30._M_head_impl,
                       in_stack_ffffffffffffff28);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            testing::Message::~Message((Message *)0x531faf);
          }
          local_50 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x53202a);
          if (local_50 == 0) {
            local_50 = 0;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffec0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffec0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec0)
      ;
      return;
    }
  }
  testing::Message::Message((Message *)in_RCX);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_RCX,type,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),iVar2,
             (char *)in_stack_fffffffffffffec0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_ffffffffffffff30._M_head_impl,in_stack_ffffffffffffff28);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
  testing::Message::~Message((Message *)0x531b4f);
  return;
}

Assistant:

virtual void DoTestMaxThreads(::libaom_test::YUVVideoSource *video,
                                const std::vector<size_t> ref_size_enc,
                                const std::vector<std::string> ref_md5_enc,
                                const std::vector<std::string> ref_md5_dec) {
    cfg_.g_threads = MAX_NUM_THREADS;
    ASSERT_NO_FATAL_FAILURE(RunLoop(video));
    std::vector<size_t> multi_thr_max_row_mt_size_enc;
    std::vector<std::string> multi_thr_max_row_mt_md5_enc;
    std::vector<std::string> multi_thr_max_row_mt_md5_dec;
    multi_thr_max_row_mt_size_enc = size_enc_;
    multi_thr_max_row_mt_md5_enc = md5_enc_;
    multi_thr_max_row_mt_md5_dec = md5_dec_;
    size_enc_.clear();
    md5_enc_.clear();
    md5_dec_.clear();

    // Check that the vectors are equal.
    ASSERT_EQ(ref_size_enc, multi_thr_max_row_mt_size_enc);
    ASSERT_EQ(ref_md5_enc, multi_thr_max_row_mt_md5_enc);
    ASSERT_EQ(ref_md5_dec, multi_thr_max_row_mt_md5_dec);
  }